

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::color3f> *this,double t)

{
  undefined1 local_30 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<tinyusdz::value::color3f> *this_local;
  
  s._16_8_ = t;
  Sample::Sample((Sample *)local_30);
  local_30._0_4_ = s.value.b;
  local_30[4] = s.blocked;
  local_30._5_3_ = s._21_3_;
  s.value.g._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>>
              *)this,(Sample *)local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }